

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall
GEO::KdTree::get_nearest_neighbors_leaf
          (KdTree *this,index_t node_index,index_t b,index_t e,double *query_point,
          NearestNeighbors *NN)

{
  index_t iVar1;
  pointer puVar2;
  index_t ii;
  ulong uVar3;
  ulong uVar4;
  index_t ii_1;
  double dVar5;
  double dVar6;
  index_t local_idx [16];
  double local_sq_dist [16];
  index_t aiStack_f8 [16];
  double adStack_b8 [17];
  
  uVar4 = (ulong)(e - b);
  NN->nb_visited = NN->nb_visited + uVar4;
  if (NN->nb_neighbors == NN->nb_neighbors_max) {
    dVar6 = NN->neighbors_sq_dist[NN->nb_neighbors - 1];
  }
  else {
    dVar6 = 1.79769313486232e+308;
  }
  puVar2 = (this->point_index_).
           super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    iVar1 = puVar2[b + uVar3];
    dVar5 = Geom::distance2<double>
                      (query_point,
                       (this->super_NearestNeighborSearch).points_ +
                       (this->super_NearestNeighborSearch).stride_ * iVar1,
                       (this->super_NearestNeighborSearch).super_Counted.field_0xc);
    aiStack_f8[uVar3] = iVar1;
    adStack_b8[uVar3] = dVar5;
  }
  for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    if (adStack_b8[uVar3] <= dVar6) {
      NearestNeighbors::insert(NN,aiStack_f8[uVar3],adStack_b8[uVar3]);
      dVar6 = 1.79769313486232e+308;
      if (NN->nb_neighbors == NN->nb_neighbors_max) {
        dVar6 = NN->neighbors_sq_dist[NN->nb_neighbors - 1];
      }
    }
  }
  return;
}

Assistant:

void KdTree::get_nearest_neighbors_leaf(
	index_t node_index, index_t b, index_t e,
	const double* query_point,
	NearestNeighbors& NN	    
    ) const {
	geo_argused(node_index);
        NN.nb_visited += (e-b);
	double R = NN.furthest_neighbor_sq_dist();
	index_t nb = e-b;
	const index_t* geo_restrict idx = &point_index_[b];

	// TODO: check generated ASM (I'd like to have AVX here).
	// We may need to dispatch according to dimension.
	
	index_t local_idx[MAX_LEAF_SIZE];
	double  local_sq_dist[MAX_LEAF_SIZE];

	// Cache indices and computed distances in local
	// array. I guess AVX likes that (to be checked).
	// Not sure, because access to p is indirect, maybe
	// I should copy the points to local memory before
	// computing the distances (or having another copy
	// of the points array that I pre-reorder so that
	// leaf's points are in a contiguous chunk of memory),
	// to be tested...
	for(index_t ii=0; ii<nb; ++ii) {
	    index_t i = idx[ii];
	    const double* geo_restrict p = point_ptr(i);
	    double sq_dist = Geom::distance2(
		query_point, p, dimension()
	    );
	    local_idx[ii] = i;
	    local_sq_dist[ii] = sq_dist;
	}

	// Now insert the points that are nearer to query
	// point than NN's bounding ball.
	for(index_t ii=0; ii<nb; ++ii) {
	    double sq_dist = local_sq_dist[ii];
	    if(sq_dist <= R) {
		NN.insert(local_idx[ii],sq_dist);
		R = NN.furthest_neighbor_sq_dist();
	    }
	}
    }